

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

void __thiscall tf::Executor::Executor(Executor *this,size_t N,shared_ptr<tf::WorkerInterface> *wix)

{
  size_type sVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  TFProfManager *this_00;
  size_type __n;
  allocator<char> local_69;
  vector<tf::Worker,_std::allocator<tf::Worker>_> *local_68;
  undefined1 local_60 [16];
  string local_50;
  
  *(undefined8 *)((long)&(this->_taskflows_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_taskflows_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_taskflows_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_taskflows_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->_taskflows_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_68 = &this->_workers;
  std::vector<tf::Worker,_std::allocator<tf::Worker>_>::vector
            (local_68,N,(allocator_type *)&local_50);
  NonblockingNotifierV2::NonblockingNotifierV2(&this->_notifier,N);
  std::condition_variable::condition_variable(&this->_topology_cv);
  (this->_topology_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->_num_topologies = 0;
  *(undefined8 *)((long)&(this->_topology_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_topology_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_topology_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_topology_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->_taskflows).super__List_base<tf::Taskflow,_std::allocator<tf::Taskflow>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->_taskflows;
  (this->_taskflows).super__List_base<tf::Taskflow,_std::allocator<tf::Taskflow>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->_taskflows;
  (this->_taskflows).super__List_base<tf::Taskflow,_std::allocator<tf::Taskflow>_>._M_impl._M_node.
  _M_size = 0;
  sVar1 = 0x3f;
  if (N != 0) {
    for (; N >> sVar1 == 0; sVar1 = sVar1 - 1) {
    }
  }
  __n = 1;
  if (3 < N) {
    __n = sVar1;
  }
  std::vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>::
  vector(&(this->_buffers)._buckets,__n,(allocator_type *)&local_50);
  (this->_worker_interface).super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (wix->super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (wix->super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (wix->super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_worker_interface).super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  (this->_worker_interface).super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  (wix->super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->_observers)._M_h._M_buckets = &(this->_observers)._M_h._M_single_bucket;
  (this->_observers)._M_h._M_bucket_count = 1;
  (this->_observers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_observers)._M_h._M_element_count = 0;
  (this->_observers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_observers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_observers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (N == 0) {
    throw_re<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp"
               ,0x479,(char (*) [41])"executor must define at least one worker");
  }
  _spawn(this,N);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"TF_ENABLE_PROFILER",&local_69);
  bVar4 = has_env(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar4) {
    this_00 = TFProfManager::get();
    make_observer<tf::TFProfObserver>((Executor *)local_60);
    TFProfManager::_manage(this_00,(shared_ptr<tf::TFProfObserver> *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  }
  return;
}

Assistant:

inline Executor::Executor(size_t N, std::shared_ptr<WorkerInterface> wix) :
  _workers  (N),
  _notifier (N),
  _buffers  (N),
  _worker_interface(std::move(wix)) {

  if(N == 0) {
    TF_THROW("executor must define at least one worker");
  }

  _spawn(N);

  // initialize the default observer if requested
  if(has_env(TF_ENABLE_PROFILER)) {
    TFProfManager::get()._manage(make_observer<TFProfObserver>());
  }
}